

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall clickhouse::Client::Impl::~Impl(Impl *this)

{
  ClientOptions *in_RDI;
  BufferedInput *in_stack_fffffffffffffff0;
  
  ServerInfo::~ServerInfo((ServerInfo *)in_RDI);
  BufferedOutput::~BufferedOutput((BufferedOutput *)in_RDI);
  SocketOutput::~SocketOutput((SocketOutput *)0x24bf91);
  BufferedInput::~BufferedInput(in_stack_fffffffffffffff0);
  SocketInput::~SocketInput((SocketInput *)0x24bfb5);
  SocketHolder::~SocketHolder((SocketHolder *)0x24bfc8);
  ClientOptions::~ClientOptions(in_RDI);
  return;
}

Assistant:

Client::Impl::~Impl()
{ }